

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.inc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::cpp_unittest::GeneratedDescriptorTest_IdenticalDescriptors_Test::
GeneratedDescriptorTest_IdenticalDescriptors_Test
          (GeneratedDescriptorTest_IdenticalDescriptors_Test *this)

{
  GeneratedDescriptorTest_IdenticalDescriptors_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__GeneratedDescriptorTest_IdenticalDescriptors_Test_02a037d0;
  return;
}

Assistant:

TEST(GENERATED_DESCRIPTOR_TEST_NAME, IdenticalDescriptors) {
  const FileDescriptor* generated_descriptor =
    UNITTEST::TestAllTypes::descriptor()->file();

  // Set up the Importer.
  MockErrorCollector error_collector;
  DiskSourceTree source_tree;
  source_tree.MapPath("", TestUtil::TestSourceDir());
  Importer importer(&source_tree, &error_collector);

  // Import (parse) unittest.proto.
  const FileDescriptor* parsed_descriptor =
      importer.Import(UNITTEST_PROTO_PATH);
  EXPECT_EQ("", error_collector.text_);
  ASSERT_TRUE(parsed_descriptor != nullptr);

  // Test that descriptors are generated correctly by converting them to
  // FileDescriptorProtos and comparing.
  FileDescriptorProto generated_descriptor_proto;
  generated_descriptor->CopyTo(&generated_descriptor_proto);
  FileDescriptorProto parsed_descriptor_proto =
    compiler::StripSourceRetentionOptions(*parsed_descriptor);

  EXPECT_EQ(parsed_descriptor_proto.DebugString(),
            generated_descriptor_proto.DebugString());
}